

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void findtest(void)

{
  char *__s1;
  void **ppvVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  ulong unaff_R12;
  int unaff_R13D;
  uint uVar10;
  int index;
  int local_54;
  long local_50;
  uint local_44;
  long local_40;
  ulong local_38;
  
  lVar6 = 0;
  do {
    if (lVar6 == 0x3c) {
      pvVar5 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,3,&index);
      if (arraylen == 0) {
        if (pvVar5 != (void *)0x0) {
          error("find(NULL,GT) gave %s(%d) should be NULL",pvVar5,(ulong)(uint)index);
        }
      }
      else if (index != 0 || pvVar5 != *array) {
        error("find(NULL,GT) gave %s(%d) should be %s(0)");
      }
      pvVar5 = findrelpos234(tree,(void *)0x0,(cmpfn234)0x0,1,&index);
      if ((long)arraylen == 0) {
        if (pvVar5 != (void *)0x0) {
          error("find(NULL,LT) gave %s(%d) should be NULL",pvVar5,(ulong)(uint)index);
        }
      }
      else if (pvVar5 != array[(long)arraylen + -1] || index != arraylen + -1) {
        error("find(NULL,LT) gave %s(%d) should be %s(0)",pvVar5);
      }
      return;
    }
    __s1 = strings[lVar6];
    local_40 = lVar6;
    for (lVar7 = 0; ppvVar1 = array, lVar7 != 5; lVar7 = lVar7 + 1) {
      local_54 = findtest::rels[lVar7];
      local_38 = (ulong)(uint)arraylen;
      uVar2 = arraylen - 1;
      uVar10 = 0;
      local_50 = lVar7;
      local_44 = uVar2;
      while ((int)uVar10 <= (int)uVar2) {
        uVar8 = uVar2 + uVar10 >> 1;
        unaff_R12 = (ulong)uVar8;
        unaff_R13D = strcmp(__s1,(char *)ppvVar1[unaff_R12]);
        if (unaff_R13D < 0) {
          uVar2 = uVar8 - 1;
        }
        else {
          if (unaff_R13D == 0) goto LAB_00102f54;
          uVar10 = uVar8 + 1;
        }
      }
      if (unaff_R13D == 0) {
LAB_00102f54:
        iVar9 = (int)unaff_R12;
        if ((int)local_50 == 4) {
          if (iVar9 < (int)local_44) {
            unaff_R12 = (ulong)(iVar9 + 1);
            goto LAB_00102fa1;
          }
        }
        else {
          if ((int)local_50 != 3) {
LAB_00102fa1:
            uVar3 = (ulong)(int)unaff_R12;
            unaff_R13D = 0;
            goto LAB_00102fa7;
          }
          if (0 < iVar9) {
            uVar3 = (ulong)(iVar9 - 1);
            unaff_R13D = 0;
            unaff_R12 = uVar3;
            goto LAB_00102fa7;
          }
        }
        unaff_R13D = 0;
        pvVar5 = (void *)0x0;
      }
      else {
        if (uVar10 != uVar2 + 1) {
          __assert_fail("lo == hi + 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/tree234.c"
                        ,0x58c,"void findtest(void)");
        }
        uVar8 = (uint)local_50;
        if ((uVar8 & 6) == 2) {
          if ((int)uVar2 < 0) {
            pvVar5 = (void *)0x0;
            unaff_R12 = (ulong)uVar2;
          }
          else {
            uVar3 = (ulong)uVar2;
            unaff_R12 = (ulong)uVar2;
LAB_00102fa7:
            pvVar5 = ppvVar1[uVar3];
          }
        }
        else {
          if ((uVar8 == 4) || (uVar8 == 1)) {
            if ((int)uVar10 < (int)local_38) {
              uVar3 = (ulong)uVar10;
              unaff_R12 = (ulong)uVar10;
              goto LAB_00102fa7;
            }
            unaff_R12 = (ulong)uVar10;
          }
          pvVar5 = (void *)0x0;
        }
      }
      lVar7 = local_50;
      pvVar4 = findrelpos234(tree,__s1,(cmpfn234)0x0,local_54,&index);
      if (pvVar4 != pvVar5) {
        error("find(\"%s\",%s) gave %s should be %s",__s1,findtest::relnames[lVar7],pvVar4,pvVar5);
      }
      if (pvVar4 != (void *)0x0) {
        if (index != (int)unaff_R12) {
          error("find(\"%s\",%s) gave %d should be %d",__s1,findtest::relnames[lVar7],
                (ulong)(uint)index,unaff_R12 & 0xffffffff);
        }
        iVar9 = index;
        if ((lVar7 == 0) && (pvVar5 = index234(tree,index), pvVar5 != pvVar4)) {
          error("find(\"%s\",%s) gave %s(%d) but %d -> %s",__s1,"EQ",pvVar4,(ulong)(uint)iVar9,
                (ulong)(uint)iVar9,pvVar5);
        }
      }
      if (verbose != 0) {
        printf("find(\"%s\",%s) gave %s(%d)\n",__s1,findtest::relnames[lVar7],pvVar4,
               (ulong)(uint)index);
      }
    }
    lVar6 = local_40 + 1;
  } while( true );
}

Assistant:

void findtest(void)
{
    const static int rels[] = {
        REL234_EQ, REL234_GE, REL234_LE, REL234_LT, REL234_GT
    };
    const static char *const relnames[] = {
        "EQ", "GE", "LE", "LT", "GT"
    };
    int i, j, rel, index;
    char *p, *ret, *realret, *realret2;
    int lo, hi, mid, c;

    for (i = 0; i < NSTR; i++) {
        p = strings[i];
        for (j = 0; j < sizeof(rels) / sizeof(*rels); j++) {
            rel = rels[j];

            lo = 0;
            hi = arraylen - 1;
            while (lo <= hi) {
                mid = (lo + hi) / 2;
                c = strcmp(p, array[mid]);
                if (c < 0)
                    hi = mid - 1;
                else if (c > 0)
                    lo = mid + 1;
                else
                    break;
            }

            if (c == 0) {
                if (rel == REL234_LT)
                    ret = (mid > 0 ? array[--mid] : NULL);
                else if (rel == REL234_GT)
                    ret = (mid < arraylen - 1 ? array[++mid] : NULL);
                else
                    ret = array[mid];
            } else {
                assert(lo == hi + 1);
                if (rel == REL234_LT || rel == REL234_LE) {
                    mid = hi;
                    ret = (hi >= 0 ? array[hi] : NULL);
                } else if (rel == REL234_GT || rel == REL234_GE) {
                    mid = lo;
                    ret = (lo < arraylen ? array[lo] : NULL);
                } else
                    ret = NULL;
            }

            realret = findrelpos234(tree, p, NULL, rel, &index);
            if (realret != ret) {
                error("find(\"%s\",%s) gave %s should be %s",
                      p, relnames[j], realret, ret);
            }
            if (realret && index != mid) {
                error("find(\"%s\",%s) gave %d should be %d",
                      p, relnames[j], index, mid);
            }
            if (realret && rel == REL234_EQ) {
                realret2 = index234(tree, index);
                if (realret2 != realret) {
                    error("find(\"%s\",%s) gave %s(%d) but %d -> %s",
                          p, relnames[j], realret, index, index, realret2);
                }
            }
            if (verbose)
                printf("find(\"%s\",%s) gave %s(%d)\n", p, relnames[j],
                       realret, index);
        }
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_GT, &index);
    if (arraylen && (realret != array[0] || index != 0)) {
        error("find(NULL,GT) gave %s(%d) should be %s(0)",
              realret, index, (char *)array[0]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,GT) gave %s(%d) should be NULL", realret, index);
    }

    realret = findrelpos234(tree, NULL, NULL, REL234_LT, &index);
    if (arraylen
        && (realret != array[arraylen - 1] || index != arraylen - 1)) {
        error("find(NULL,LT) gave %s(%d) should be %s(0)", realret, index,
              (char *)array[arraylen - 1]);
    } else if (!arraylen && (realret != NULL)) {
        error("find(NULL,LT) gave %s(%d) should be NULL", realret, index);
    }
}